

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O2

void __thiscall User::~User(User *this)

{
  std::__cxx11::string::~string((string *)&this->password);
  std::__cxx11::string::~string((string *)&this->bio);
  std::__cxx11::string::~string((string *)&this->alias);
  std::__cxx11::string::~string((string *)&this->username);
  return;
}

Assistant:

User(int id, std::string username, std::string alias, std::string bio, std::string password)
  {
	  this->id = id;
	  this->username = username;
	  this->alias = alias;
	  this->bio = bio;
	  this->password = password;
  }